

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createRealloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  RWNode *target;
  Offset *s;
  RWNode *in_RSI;
  long in_RDI;
  uint64_t size;
  RWNode *node;
  uint64_t in_stack_000000e8;
  RWNode *in_stack_000000f0;
  Instruction *in_stack_000000f8;
  LLVMReadWriteGraphBuilder *in_stack_00000100;
  undefined8 in_stack_ffffffffffffffb8;
  RWNodeType t;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd7;
  Offset in_stack_ffffffffffffffd8;
  Offset *off;
  
  t = (RWNodeType)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  target = create(in_stack_ffffffffffffffc0,t);
  llvm::User::getOperand((User *)in_stack_ffffffffffffffc0,t);
  s = (Offset *)llvmutils::getConstantValue((Value *)in_stack_ffffffffffffffc0);
  off = Offset::UNKNOWN;
  if (s != (Offset *)0x0) {
    SubgraphNode<dg::dda::RWNode>::setSize(&target->super_SubgraphNode<dg::dda::RWNode>,(size_t)s);
    off = s;
  }
  Offset::Offset((Offset *)&stack0xffffffffffffffd8,0);
  Offset::Offset((Offset *)&stack0xffffffffffffffd0,(type)off);
  RWNode::addDef(in_RSI,target,off,(Offset *)in_stack_ffffffffffffffd8.offset,
                 (bool)in_stack_ffffffffffffffd7);
  if ((*(byte *)(in_RDI + 0xe0) & 1) != 0) {
    addReallocUses(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  }
  return target;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createRealloc(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::DYN_ALLOC);

    uint64_t size = llvmutils::getConstantValue(Inst->getOperand(1));
    if (size == 0)
        size = Offset::UNKNOWN;
    else
        node.setSize(size);

    // realloc defines itself, since it copies the values
    // from previous memory
    node.addDef(&node, 0, size, false /* strong update */);

    if (buildUses) {
        // realloc copies the memory
        // NOTE: do not use mapPointers, it could lead to infinite
        // recursion as realloc may use itself and the 'node' is not
        // in the map yet
        addReallocUses(Inst, node, size);
    }
    return &node;
}